

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language)

{
  cmLocalNinjaGenerator *pcVar1;
  cmGeneratorTarget *headTarget;
  bool bVar2;
  char *pcVar3;
  string *psVar4;
  string COMPILE_OPTIONS;
  string COMPILE_FLAGS;
  cmGeneratorExpressionInterpreter genexInterpreter;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  cmGeneratorExpressionInterpreter local_98;
  
  cmCommonTargetGenerator::GetFlags
            (__return_storage_ptr__,&this->super_cmCommonTargetGenerator,language);
  bVar2 = std::operator==(language,"Fortran");
  if (bVar2) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source);
  }
  pcVar1 = this->LocalGenerator;
  std::__cxx11::string::string
            ((string *)&local_b8,(string *)&(pcVar1->super_cmLocalCommonGenerator).ConfigName);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string((string *)&local_d8,(string *)language);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_98,(cmLocalGenerator *)pcVar1,&local_b8,headTarget,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"COMPILE_FLAGS",(allocator<char> *)&local_118);
  pcVar3 = cmSourceFile::GetProperty(source,&local_f8);
  if (pcVar3 != (char *)0x0) {
    pcVar1 = this->LocalGenerator;
    psVar4 = cmGeneratorExpressionInterpreter::Evaluate(&local_98,pcVar3,&local_f8);
    (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar1,__return_storage_ptr__,psVar4);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"COMPILE_OPTIONS",&local_119);
  pcVar3 = cmSourceFile::GetProperty(source,&local_118);
  if (pcVar3 != (char *)0x0) {
    pcVar1 = this->LocalGenerator;
    psVar4 = cmGeneratorExpressionInterpreter::Evaluate(&local_98,pcVar3,&local_118);
    cmLocalGenerator::AppendCompileOptions
              ((cmLocalGenerator *)pcVar1,__return_storage_ptr__,psVar4,(char *)0x0);
  }
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter(&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeFlagsForObject(
  cmSourceFile const* source, const std::string& language)
{
  std::string flags = this->GetFlags(language);

  // Add Fortran format flags.
  if (language == "Fortran") {
    this->AppendFortranFormatFlags(flags, *source);
  }

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, this->LocalGenerator->GetConfigName(),
    this->GeneratorTarget, language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (const char* cflags = source->GetProperty(COMPILE_FLAGS)) {
    this->LocalGenerator->AppendFlags(
      flags, genexInterpreter.Evaluate(cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (const char* coptions = source->GetProperty(COMPILE_OPTIONS)) {
    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(coptions, COMPILE_OPTIONS));
  }

  return flags;
}